

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O0

int print_distpoint(BIO *out,DIST_POINT_NAME *dpn,int indent)

{
  anon_union_8_2_ced00d1e_for_name local_48;
  X509_NAME ntmp;
  int indent_local;
  DIST_POINT_NAME *dpn_local;
  BIO *out_local;
  
  ntmp._36_4_ = indent;
  if (dpn->type == 0) {
    BIO_printf((BIO *)out,"%*sFull Name:\n",(ulong)(uint)indent,"");
    print_gens(out,(dpn->name).fullname,ntmp._36_4_);
  }
  else {
    local_48 = dpn->name;
    BIO_printf((BIO *)out,"%*sRelative Name:\n%*s",(ulong)(uint)indent,"",(ulong)(indent + 2));
    X509_NAME_print_ex((BIO *)out,(X509_NAME *)&local_48,0,0x82031f);
    BIO_puts((BIO *)out,"\n");
  }
  return 1;
}

Assistant:

static int print_distpoint(BIO *out, DIST_POINT_NAME *dpn, int indent) {
  if (dpn->type == 0) {
    BIO_printf(out, "%*sFull Name:\n", indent, "");
    print_gens(out, dpn->name.fullname, indent);
  } else {
    X509_NAME ntmp;
    ntmp.entries = dpn->name.relativename;
    BIO_printf(out, "%*sRelative Name:\n%*s", indent, "", indent + 2, "");
    X509_NAME_print_ex(out, &ntmp, 0, XN_FLAG_ONELINE);
    BIO_puts(out, "\n");
  }
  return 1;
}